

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

void duckdb::TimeBucketOriginFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  bool bVar2;
  BucketWidthType BVar3;
  reference a;
  reference b;
  reference c;
  NotImplementedException *this;
  idx_t count;
  code *fun;
  interval_t in_stack_ffffffffffffffa8;
  
  a = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  b = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  c = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  if ((a->vector_type == CONSTANT_VECTOR) && (c->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
       ((puVar1 = (c->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
      bVar2 = Value::IsFinite<duckdb::timestamp_t>((timestamp_t)*(int64_t *)c->data);
      if (bVar2) {
        BVar3 = TimeBucket::ClassifyBucketWidth(in_stack_ffffffffffffffa8);
        if (BVar3 != UNCLASSIFIED) {
          if (BVar3 == CONVERTIBLE_TO_MONTHS) {
            count = args->count;
            fun = TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
                  Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
            ;
          }
          else {
            if (BVar3 != CONVERTIBLE_TO_MICROS) {
              this = (NotImplementedException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&stack0xffffffffffffffb0,
                         "Bucket type not implemented for TIME_BUCKET",
                         (allocator *)&stack0xffffffffffffffaf);
              NotImplementedException::NotImplementedException
                        (this,(string *)&stack0xffffffffffffffb0);
              __cxa_throw(this,&NotImplementedException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            count = args->count;
            fun = TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
                  Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
            ;
          }
          TernaryExecutor::
          ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t)>
                    (a,b,c,result,count,fun);
          return;
        }
        goto LAB_00c4bbb0;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
LAB_00c4bbb0:
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
            (a,b,c,result,args->count,
             TimeBucket::OriginTernaryOperator::
             Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
            );
  return;
}

Assistant:

static void TimeBucketOriginFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &origin_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR &&
	    origin_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg) || ConstantVector::IsNull(origin_arg) ||
		    !Value::IsFinite(*ConstantVector::GetData<T>(origin_arg))) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
		    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
		    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
	}
}